

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpki-rov.c
# Opt level: O2

int connection_error(rtr_mgr_status status)

{
  long lVar1;
  long in_FS_OFFSET;
  char input [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (status == RTR_MGR_ERROR) {
    fgets(input,0x100,_stdin);
    puts("error");
    fflush(_stdout);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint)(status == RTR_MGR_ERROR);
  }
  __stack_chk_fail();
}

Assistant:

static int connection_error(enum rtr_mgr_status status)
{
	if (status == RTR_MGR_ERROR) {
		/*
		 * Wait for input before printing error to avoid "broken pipe" error
		 * while communicating with the Python program.
		 */
		char input[256];

		if (fgets(input, 256, stdin))
			;
		printf("error\n");
		fflush(stdout);
		return 1;
	}
	return 0;
}